

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void printCond4Operand(MCInst *MI,int OpNum,SStream *O)

{
  MCOperand *op;
  SStream *ss;
  uint in_ESI;
  MCInst *in_RDI;
  uint64_t Imm;
  char *in_stack_ffffffffffffffd8;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  ss = (SStream *)MCOperand_getImm(op);
  SStream_concat0(ss,in_stack_ffffffffffffffd8);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    (in_RDI->flat_insn->detail->field_6).arm64.cc = (arm64_cc)ss;
  }
  return;
}

Assistant:

static void printCond4Operand(MCInst *MI, int OpNum, SStream *O)
{
	static const char *const CondNames[] = {
		"o", "h", "nle", "l", "nhe", "lh", "ne",
		"e", "nlh", "he", "nl", "le", "nh", "no"
	};

	uint64_t Imm = MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// assert(Imm > 0 && Imm < 15 && "Invalid condition");
	SStream_concat0(O, CondNames[Imm - 1]);

	if (MI->csh->detail)
		MI->flat_insn->detail->sysz.cc = (sysz_cc)Imm;
}